

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_column_schema.hpp
# Opt level: O2

void __thiscall duckdb::ParquetColumnSchema::ParquetColumnSchema(ParquetColumnSchema *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  duckdb::LogicalType::LogicalType(&this->type);
  (this->parent_schema_index).index = 0xffffffffffffffff;
  this->type_length = 0;
  this->type_scale = 0;
  this->parquet_type = INT32;
  *(undefined8 *)&this->type_info = 0;
  *(undefined8 *)
   ((long)&(this->children).
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->children).
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ParquetColumnSchema() = default;